

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::GDBIndexEntryKindString(GDBIndexEntryKind Kind)

{
  undefined1 auStack_18 [4];
  GDBIndexEntryKind Kind_local;
  
  switch(Kind) {
  case GIEK_NONE:
    StringRef::StringRef((StringRef *)auStack_18,"NONE");
    break;
  case GIEK_TYPE:
    StringRef::StringRef((StringRef *)auStack_18,"TYPE");
    break;
  case GIEK_VARIABLE:
    StringRef::StringRef((StringRef *)auStack_18,"VARIABLE");
    break;
  case GIEK_FUNCTION:
    StringRef::StringRef((StringRef *)auStack_18,"FUNCTION");
    break;
  case GIEK_OTHER:
    StringRef::StringRef((StringRef *)auStack_18,"OTHER");
    break;
  case GIEK_UNUSED5:
    StringRef::StringRef((StringRef *)auStack_18,"UNUSED5");
    break;
  case GIEK_UNUSED6:
    StringRef::StringRef((StringRef *)auStack_18,"UNUSED6");
    break;
  case GIEK_UNUSED7:
    StringRef::StringRef((StringRef *)auStack_18,"UNUSED7");
    break;
  default:
    llvm_unreachable_internal
              ("Unknown GDBIndexEntryKind value",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Dwarf.cpp"
               ,0x24f);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::GDBIndexEntryKindString(GDBIndexEntryKind Kind) {
  switch (Kind) {
  case GIEK_NONE:
    return "NONE";
  case GIEK_TYPE:
    return "TYPE";
  case GIEK_VARIABLE:
    return "VARIABLE";
  case GIEK_FUNCTION:
    return "FUNCTION";
  case GIEK_OTHER:
    return "OTHER";
  case GIEK_UNUSED5:
    return "UNUSED5";
  case GIEK_UNUSED6:
    return "UNUSED6";
  case GIEK_UNUSED7:
    return "UNUSED7";
  }
  llvm_unreachable("Unknown GDBIndexEntryKind value");
}